

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void var_smul_wnaf_two(pt_aff_t_conflict4 *out,uchar *a,uchar *b,pt_aff_t_conflict4 *P)

{
  pt_prj_t_conflict4 precomp [16];
  pt_prj_t_conflict4 Q;
  int8_t bnaf [513];
  int8_t anaf [513];
  int flipped;
  int is_inf;
  int is_neg;
  int d;
  int i;
  pt_aff_t_conflict4 *in_stack_ffffffffffffe668;
  undefined4 in_stack_ffffffffffffe670;
  undefined4 in_stack_ffffffffffffe674;
  undefined1 local_1988 [80];
  undefined1 auStack_1938 [64];
  pt_prj_t_conflict4 *in_stack_ffffffffffffe708;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe710;
  undefined1 auStack_18e8 [80];
  undefined1 auStack_1898 [128];
  pt_prj_t_conflict4 *in_stack_ffffffffffffe7e8;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe7f0;
  pt_aff_t_conflict4 *in_stack_ffffffffffffe800;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe808;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe810;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe818;
  pt_prj_t_conflict4 *in_stack_ffffffffffffe820;
  uint64_t *in_stack_ffffffffffffea78;
  uint64_t *in_stack_ffffffffffffea80;
  uint64_t *in_stack_fffffffffffff250;
  uint64_t *in_stack_fffffffffffff258;
  uint64_t *in_stack_fffffffffffff260;
  uint64_t local_588 [10];
  undefined1 auStack_538 [80];
  uint64_t auStack_4e8 [10];
  undefined1 auStack_498 [80];
  char local_448 [528];
  char local_238 [516];
  uint local_34;
  int local_30;
  uint local_2c;
  int local_28;
  int local_24;
  
  local_30 = 1;
  local_34 = 0;
  memset(local_238,0,0x201);
  memset(local_448,0,0x201);
  memset(local_588,0,0x140);
  precomp_wnaf((pt_prj_t_conflict4 *)CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
               in_stack_ffffffffffffe668);
  scalar_wnaf((int8_t *)CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
              (uchar *)in_stack_ffffffffffffe668);
  scalar_wnaf((int8_t *)CONCAT44(in_stack_ffffffffffffe674,in_stack_ffffffffffffe670),
              (uchar *)in_stack_ffffffffffffe668);
  for (local_24 = 0x200; -1 < local_24; local_24 = local_24 + -1) {
    if (local_30 == 0) {
      point_double(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7e8);
    }
    local_28 = (int)local_448[local_24];
    if (local_28 != 0) {
      local_2c = (uint)(local_28 < 0);
      if (local_2c != local_34) {
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_588,local_588);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(auStack_4e8,auStack_4e8);
        local_34 = local_34 ^ 1;
      }
      if (local_2c != 0) {
        local_28 = -local_28;
      }
      local_28 = local_28 + -1 >> 1;
      if (local_30 == 0) {
        point_add_proj(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818,in_stack_ffffffffffffe810
                      );
      }
      else {
        memcpy(local_588,local_1988 + (long)local_28 * 0x140,0x50);
        memcpy(auStack_538,auStack_1938 + (long)local_28 * 0x140,0x50);
        memcpy(auStack_4e8,auStack_18e8 + (long)local_28 * 0x140,0x50);
        memcpy(auStack_498,auStack_1898 + (long)local_28 * 0x140,0x50);
        local_30 = 0;
      }
    }
    local_28 = (int)local_238[local_24];
    if (local_28 != 0) {
      local_2c = (uint)(local_28 < 0);
      if (local_2c != local_34) {
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_588,local_588);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(auStack_4e8,auStack_4e8);
        local_34 = local_34 ^ 1;
      }
      if (local_2c != 0) {
        local_28 = -local_28;
      }
      local_28 = local_28 + -1 >> 1;
      if (local_30 == 0) {
        point_add_mixed(in_stack_ffffffffffffe810,in_stack_ffffffffffffe808,
                        in_stack_ffffffffffffe800);
      }
      else {
        memcpy(local_588,lut_cmb[0] + local_28,0x50);
        memcpy(auStack_538,lut_cmb[0][local_28].Y,0x50);
        memcpy(auStack_4e8,lut_cmb[0][local_28].T,0x50);
        memcpy(auStack_498,const_one,0x50);
        local_30 = 0;
      }
    }
  }
  if (local_30 != 0) {
    memset(local_588,0,0x50);
    memcpy(auStack_538,const_one,0x50);
    memset(auStack_4e8,0,0x50);
    memcpy(auStack_498,const_one,0x50);
  }
  if (local_34 != 0) {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(local_588,local_588);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(auStack_4e8,auStack_4e8);
  }
  point_edwards2legacy(in_stack_ffffffffffffe710,in_stack_ffffffffffffe708);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(in_stack_ffffffffffffea80,in_stack_ffffffffffffea78)
  ;
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  return;
}

Assistant:

static void var_smul_wnaf_two(pt_aff_t *out, const unsigned char a[64],
                              const unsigned char b[64], const pt_aff_t *P) {
    int i, d, is_neg, is_inf = 1, flipped = 0;
    int8_t anaf[513] = {0};
    int8_t bnaf[513] = {0};
    pt_prj_t Q = {0};
    pt_prj_t precomp[DRADIX / 2];

    precomp_wnaf(precomp, P);
    scalar_wnaf(anaf, a);
    scalar_wnaf(bnaf, b);

    for (i = 512; i >= 0; i--) {
        if (!is_inf) point_double(&Q, &Q);
        if ((d = bnaf[i])) {
            if ((is_neg = d < 0) != flipped) {
                fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.X, Q.X);
                fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.T, Q.T);
                flipped ^= 1;
            }
            d = (is_neg) ? (-d - 1) >> 1 : (d - 1) >> 1;
            if (is_inf) {
                /* initialize accumulator */
                fe_copy(Q.X, &precomp[d].X);
                fe_copy(Q.Y, &precomp[d].Y);
                fe_copy(Q.T, &precomp[d].T);
                fe_copy(Q.Z, &precomp[d].Z);
                is_inf = 0;
            } else
                point_add_proj(&Q, &Q, &precomp[d]);
        }
        if ((d = anaf[i])) {
            if ((is_neg = d < 0) != flipped) {
                fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.X, Q.X);
                fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.T, Q.T);
                flipped ^= 1;
            }
            d = (is_neg) ? (-d - 1) >> 1 : (d - 1) >> 1;
            if (is_inf) {
                /* initialize accumulator */
                fe_copy(Q.X, &lut_cmb[0][d].X);
                fe_copy(Q.Y, &lut_cmb[0][d].Y);
                fe_copy(Q.T, &lut_cmb[0][d].T);
                fe_copy(Q.Z, const_one);
                is_inf = 0;
            } else
                point_add_mixed(&Q, &Q, &lut_cmb[0][d]);
        }
    }

    if (is_inf) {
        /* initialize accumulator to inf: all-zero scalars */
        fe_set_zero(Q.X);
        fe_copy(Q.Y, const_one);
        fe_set_zero(Q.T);
        fe_copy(Q.Z, const_one);
    }

    if (flipped) {
        /* correct sign */
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.X, Q.X);
        fiat_id_tc26_gost_3410_2012_512_paramSetC_opp(Q.T, Q.T);
    }

    /* move from Edwards projective to legacy projective */
    point_edwards2legacy(&Q, &Q);
    /* convert to affine -- NB depends on coordinate system */
    fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(Q.Z, Q.Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out->X, Q.X, Q.Z);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(out->Y, Q.Y, Q.Z);
}